

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector4 * vector4_get_reference_vector4(int id)

{
  vector4 *pvStack_10;
  int id_local;
  
  switch(id) {
  case 0:
    pvStack_10 = &_vector4_zero;
    break;
  case 1:
    pvStack_10 = &_vector4_unit_x;
    break;
  case 2:
    pvStack_10 = &_vector4_unit_y;
    break;
  case 3:
    pvStack_10 = &_vector4_unit_z;
    break;
  case 4:
    pvStack_10 = &_vector4_unit_x_negative;
    break;
  case 5:
    pvStack_10 = &_vector4_unit_y_negative;
    break;
  case 6:
    pvStack_10 = &_vector4_unit_z_negative;
    break;
  case 7:
    pvStack_10 = &_vector4_one;
    break;
  default:
    pvStack_10 = &_vector4_zero;
  }
  return pvStack_10;
}

Assistant:

HYPAPI const struct vector4 *vector4_get_reference_vector4(int id)
{
	switch (id) {
	case HYP_REF_VECTOR4_ZERO:
		return &_vector4_zero;
	case HYP_REF_VECTOR4_ONE:
		return &_vector4_one;
	case HYP_REF_VECTOR4_UNIT_X:
		return &_vector4_unit_x;
	case HYP_REF_VECTOR4_UNIT_Y:
		return &_vector4_unit_y;
	case HYP_REF_VECTOR4_UNIT_Z:
		return &_vector4_unit_z;
	case HYP_REF_VECTOR4_UNIT_X_NEGATIVE:
		return &_vector4_unit_x_negative;
	case HYP_REF_VECTOR4_UNIT_Y_NEGATIVE:
		return &_vector4_unit_y_negative;
	case HYP_REF_VECTOR4_UNIT_Z_NEGATIVE:
		return &_vector4_unit_z_negative;
	default:
		/* undefined case */
		return &_vector4_zero;
	}
}